

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

void crnlib::LzmaEnc_Init(CLzmaEnc *p)

{
  uint uVar1;
  UInt16 *pUVar2;
  long lVar3;
  uint uVar4;
  UInt16 (*paUVar5) [16];
  UInt16 (*paUVar6) [64];
  int iVar7;
  UInt32 j;
  long lVar8;
  ulong uVar9;
  
  lVar3 = 0;
  p->state = 0;
  p->reps[0] = 0;
  p->reps[1] = 0;
  p->reps[2] = 0;
  p->reps[3] = 0;
  (p->rc).low = 0;
  (p->rc).range = 0xffffffff;
  (p->rc).cacheSize = 1;
  (p->rc).cache = '\0';
  (p->rc).buf = (p->rc).bufBase;
  (p->rc).processed = 0;
  (p->rc).res = 0;
  paUVar5 = p->isRep0Long;
  do {
    lVar8 = 0;
    do {
      paUVar5[-0xf][lVar8] = 0x400;
      (*paUVar5)[lVar8] = 0x400;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    p->isRep[lVar3] = 0x400;
    p->isRepG0[lVar3] = 0x400;
    p->isRepG1[lVar3] = 0x400;
    p->isRepG2[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
    paUVar5 = paUVar5 + 1;
  } while (lVar3 != 0xc);
  uVar1 = p->lp;
  uVar4 = p->lc + uVar1;
  if (uVar4 < 0x18) {
    iVar7 = 0x300 << ((byte)uVar4 & 0x1f);
    pUVar2 = p->litProbs;
    uVar9 = 0;
    do {
      pUVar2[uVar9] = 0x400;
      uVar9 = uVar9 + 1;
    } while (iVar7 + (uint)(iVar7 == 0) != uVar9);
  }
  paUVar6 = p->posSlotEncoder;
  lVar3 = 0;
  do {
    lVar8 = 0;
    do {
      (*paUVar6)[lVar8] = 0x400;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x40);
    lVar3 = lVar3 + 1;
    paUVar6 = paUVar6 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  do {
    p->posEncoders[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x72);
  (p->lenEnc).p.choice = 0x400;
  (p->lenEnc).p.choice2 = 0x400;
  lVar3 = 0;
  do {
    (p->lenEnc).p.low[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  lVar3 = 0;
  do {
    (p->lenEnc).p.mid[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  lVar3 = 0;
  do {
    (p->lenEnc).p.high[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  (p->repLenEnc).p.choice = 0x400;
  (p->repLenEnc).p.choice2 = 0x400;
  lVar3 = 0;
  do {
    (p->repLenEnc).p.low[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  lVar3 = 0;
  do {
    (p->repLenEnc).p.mid[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x80);
  lVar3 = 0;
  do {
    (p->repLenEnc).p.high[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  lVar3 = 0;
  do {
    p->posAlignEncoder[lVar3] = 0x400;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;
  p->pbMask = ~(-1 << ((byte)p->pb & 0x1f));
  p->lpMask = ~(-1 << ((byte)uVar1 & 0x1f));
  return;
}

Assistant:

void LzmaEnc_Init(CLzmaEnc* p) {
  UInt32 i;
  p->state = 0;
  for (i = 0; i < LZMA_NUM_REPS; i++)
    p->reps[i] = 0;

  RangeEnc_Init(&p->rc);

  for (i = 0; i < kNumStates; i++) {
    UInt32 j;
    for (j = 0; j < LZMA_NUM_PB_STATES_MAX; j++) {
      p->isMatch[i][j] = kProbInitValue;
      p->isRep0Long[i][j] = kProbInitValue;
    }
    p->isRep[i] = kProbInitValue;
    p->isRepG0[i] = kProbInitValue;
    p->isRepG1[i] = kProbInitValue;
    p->isRepG2[i] = kProbInitValue;
  }

  {
    UInt32 num = 0x300 << (p->lp + p->lc);
    for (i = 0; i < num; i++)
      p->litProbs[i] = kProbInitValue;
  }

  {
    for (i = 0; i < kNumLenToPosStates; i++) {
      CLzmaProb* probs = p->posSlotEncoder[i];
      UInt32 j;
      for (j = 0; j < (1 << kNumPosSlotBits); j++)
        probs[j] = kProbInitValue;
    }
  }
  {
    for (i = 0; i < kNumFullDistances - kEndPosModelIndex; i++)
      p->posEncoders[i] = kProbInitValue;
  }

  LenEnc_Init(&p->lenEnc.p);
  LenEnc_Init(&p->repLenEnc.p);

  for (i = 0; i < (1 << kNumAlignBits); i++)
    p->posAlignEncoder[i] = kProbInitValue;

  p->optimumEndIndex = 0;
  p->optimumCurrentIndex = 0;
  p->additionalOffset = 0;

  p->pbMask = (1 << p->pb) - 1;
  p->lpMask = (1 << p->lp) - 1;
}